

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_constraints.cpp
# Opt level: O1

void duckdb::ExtractReferencedColumns
               (ParsedExpression *expr,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *result)

{
  ColumnRefExpression *this;
  string *__x;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  if ((expr->super_BaseExpression).expression_class == COLUMN_REF) {
    this = BaseExpression::Cast<duckdb::ColumnRefExpression>(&expr->super_BaseExpression);
    __x = ColumnRefExpression::GetColumnName_abi_cxx11_(this);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)result,__x);
  }
  local_38._8_8_ = 0;
  pcStack_20 = ::std::
               _Function_handler<void_(const_duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/function/table/system/duckdb_constraints.cpp:133:12)>
               ::_M_invoke;
  local_28 = ::std::
             _Function_handler<void_(const_duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/function/table/system/duckdb_constraints.cpp:133:12)>
             ::_M_manager;
  local_38._M_unused._M_object = result;
  ParsedExpressionIterator::EnumerateChildren
            (expr,(function<void_(const_duckdb::ParsedExpression_&)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

void ExtractReferencedColumns(const ParsedExpression &expr, vector<string> &result) {
	if (expr.GetExpressionClass() == ExpressionClass::COLUMN_REF) {
		auto &colref = expr.Cast<ColumnRefExpression>();
		result.push_back(colref.GetColumnName());
	}
	ParsedExpressionIterator::EnumerateChildren(
	    expr, [&](const ParsedExpression &child) { ExtractReferencedColumns(child, result); });
}